

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::EncryptWallet(CWallet *this,SecureString *strWalletPassphrase)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  mapped_type *this_00;
  WalletBatch *this_01;
  WalletDatabase *pWVar8;
  _Base_ptr p_Var9;
  LegacyScriptPubKeyMan *pLVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  Span<unsigned_char> bytes_00;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_01;
  CMasterKey local_f8;
  CKeyingMaterial _vMasterKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CCrypter crypter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    bVar2 = false;
    goto LAB_00145155;
  }
  _vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  _vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize(&_vMasterKey,0x20);
  bytes.m_size = (long)_vMasterKey.
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)_vMasterKey.
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
  bytes.m_data = _vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  GetStrongRandBytes(bytes);
  CMasterKey::CMasterKey(&local_f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8.vchSalt,8);
  bytes_00.m_size =
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  bytes_00.m_data =
       local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  GetStrongRandBytes(bytes_00);
  CCrypter::CCrypter(&crypter);
  lVar6 = std::chrono::_V2::steady_clock::now();
  salt._M_extent._M_extent_value =
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  salt._M_ptr = local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CCrypter::SetKeyFromPassphrase(&crypter,strWalletPassphrase,salt,25000,local_f8.nDerivationMethod)
  ;
  lVar7 = std::chrono::_V2::steady_clock::now();
  local_f8.nDeriveIterations = (uint)(long)(2500000000000.0 / (double)(lVar7 - lVar6));
  lVar6 = std::chrono::_V2::steady_clock::now();
  salt_00._M_extent._M_extent_value =
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  salt_00._M_ptr =
       local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  CCrypter::SetKeyFromPassphrase
            (&crypter,strWalletPassphrase,salt_00,local_f8.nDeriveIterations,
             local_f8.nDerivationMethod);
  uVar4 = local_f8.nDeriveIterations;
  uVar11 = (ulong)local_f8.nDeriveIterations;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar4 = (int)(long)(((double)uVar11 * 100.0 * 1000000.0) / (double)(lVar7 - lVar6)) + uVar4;
  local_f8.nDeriveIterations = 25000;
  if (49999 < uVar4) {
    local_f8.nDeriveIterations = uVar4 >> 1;
  }
  WalletLogPrintf<unsigned_int>
            (this,"Encrypting Wallet with an nDeriveIterations of %i\n",local_f8.nDeriveIterations);
  salt_01._M_extent._M_extent_value =
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  salt_01._M_ptr =
       local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  bVar2 = CCrypter::SetKeyFromPassphrase
                    (&crypter,strWalletPassphrase,salt_01,local_f8.nDeriveIterations,
                     local_f8.nDerivationMethod);
  if (bVar2) {
    bVar2 = CCrypter::Encrypt(&crypter,&_vMasterKey,&local_f8.vchCryptedKey);
    if (!bVar2) goto LAB_00145132;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock1,&this->m_relock_mutex,"m_relock_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0x348,false);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock2,&this->cs_wallet,"cs_wallet",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0x348,false);
    this->nMasterKeyMaxID = this->nMasterKeyMaxID + 1;
    this_00 = std::
              map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
              ::operator[](&this->mapMasterKeys,&this->nMasterKeyMaxID);
    CMasterKey::operator=(this_00,&local_f8);
    this_01 = (WalletBatch *)operator_new(0x10);
    pWVar8 = GetDatabase(this);
    (*pWVar8->_vptr_WalletDatabase[0xe])(this_01,pWVar8,1);
    this_01->m_database = pWVar8;
    bVar2 = WalletBatch::TxnBegin(this_01);
    if (!bVar2) {
      std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
      ~unique_ptr((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
                  this_01);
      operator_delete(this_01,0x10);
LAB_0014511b:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
      goto LAB_00145132;
    }
    WalletBatch::WriteMasterKey(this_01,this->nMasterKeyMaxID,&local_f8);
    for (p_Var9 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      cVar3 = (**(code **)(**(long **)(p_Var9 + 2) + 0x28))
                        (*(long **)(p_Var9 + 2),&_vMasterKey,this_01);
      if (cVar3 == '\0') {
        WalletBatch::TxnAbort(this_01);
        WalletBatch::~WalletBatch(this_01);
        operator_delete(this_01,0x10);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x35a,"bool wallet::CWallet::EncryptWallet(const SecureString &)");
      }
    }
    SetMinVersion(this,FEATURE_WALLETCRYPT,this_01);
    bVar2 = WalletBatch::TxnCommit(this_01);
    if (!bVar2) {
      WalletBatch::~WalletBatch(this_01);
      operator_delete(this_01,0x10);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x366,"bool wallet::CWallet::EncryptWallet(const SecureString &)");
    }
    std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::~unique_ptr
              ((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
               this_01);
    operator_delete(this_01,0x10);
    Lock(this);
    Unlock(this,strWalletPassphrase);
    if ((((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) ||
       (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x21 & 1) != 0)) {
      pLVar10 = GetLegacyScriptPubKeyMan(this);
      if (pLVar10 != (LegacyScriptPubKeyMan *)0x0) {
        iVar5 = (*(pLVar10->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])
                          (pLVar10);
        if ((char)iVar5 != '\0') {
          iVar5 = (*(pLVar10->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xb]
                  )(pLVar10,1);
          if ((char)iVar5 == '\0') goto LAB_0014511b;
        }
      }
    }
    else {
      SetupDescriptorScriptPubKeyMans(this);
    }
    Lock(this);
    pWVar8 = GetDatabase(this);
    (*pWVar8->_vptr_WalletDatabase[5])(pWVar8,0);
    pWVar8 = GetDatabase(this);
    (*pWVar8->_vptr_WalletDatabase[0xb])(pWVar8);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
    bVar2 = true;
    boost::signals2::
    signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyStatusChanged,this);
  }
  else {
LAB_00145132:
    bVar2 = false;
  }
  CCrypter::~CCrypter(&crypter);
  CMasterKey::~CMasterKey(&local_f8);
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            (&_vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
LAB_00145155:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::EncryptWallet(const SecureString& strWalletPassphrase)
{
    if (IsCrypted())
        return false;

    CKeyingMaterial _vMasterKey;

    _vMasterKey.resize(WALLET_CRYPTO_KEY_SIZE);
    GetStrongRandBytes(_vMasterKey);

    CMasterKey kMasterKey;

    kMasterKey.vchSalt.resize(WALLET_CRYPTO_SALT_SIZE);
    GetStrongRandBytes(kMasterKey.vchSalt);

    CCrypter crypter;
    constexpr MillisecondsDouble target{100};
    auto start{SteadyClock::now()};
    crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, 25000, kMasterKey.nDerivationMethod);
    kMasterKey.nDeriveIterations = static_cast<unsigned int>(25000 * target / (SteadyClock::now() - start));

    start = SteadyClock::now();
    crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, kMasterKey.nDeriveIterations, kMasterKey.nDerivationMethod);
    kMasterKey.nDeriveIterations = (kMasterKey.nDeriveIterations + static_cast<unsigned int>(kMasterKey.nDeriveIterations * target / (SteadyClock::now() - start))) / 2;

    if (kMasterKey.nDeriveIterations < 25000)
        kMasterKey.nDeriveIterations = 25000;

    WalletLogPrintf("Encrypting Wallet with an nDeriveIterations of %i\n", kMasterKey.nDeriveIterations);

    if (!crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, kMasterKey.nDeriveIterations, kMasterKey.nDerivationMethod))
        return false;
    if (!crypter.Encrypt(_vMasterKey, kMasterKey.vchCryptedKey))
        return false;

    {
        LOCK2(m_relock_mutex, cs_wallet);
        mapMasterKeys[++nMasterKeyMaxID] = kMasterKey;
        WalletBatch* encrypted_batch = new WalletBatch(GetDatabase());
        if (!encrypted_batch->TxnBegin()) {
            delete encrypted_batch;
            encrypted_batch = nullptr;
            return false;
        }
        encrypted_batch->WriteMasterKey(nMasterKeyMaxID, kMasterKey);

        for (const auto& spk_man_pair : m_spk_managers) {
            auto spk_man = spk_man_pair.second.get();
            if (!spk_man->Encrypt(_vMasterKey, encrypted_batch)) {
                encrypted_batch->TxnAbort();
                delete encrypted_batch;
                encrypted_batch = nullptr;
                // We now probably have half of our keys encrypted in memory, and half not...
                // die and let the user reload the unencrypted wallet.
                assert(false);
            }
        }

        // Encryption was introduced in version 0.4.0
        SetMinVersion(FEATURE_WALLETCRYPT, encrypted_batch);

        if (!encrypted_batch->TxnCommit()) {
            delete encrypted_batch;
            encrypted_batch = nullptr;
            // We now have keys encrypted in memory, but not on disk...
            // die to avoid confusion and let the user reload the unencrypted wallet.
            assert(false);
        }

        delete encrypted_batch;
        encrypted_batch = nullptr;

        Lock();
        Unlock(strWalletPassphrase);

        // If we are using descriptors, make new descriptors with a new seed
        if (IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS) && !IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET)) {
            SetupDescriptorScriptPubKeyMans();
        } else if (auto spk_man = GetLegacyScriptPubKeyMan()) {
            // if we are using HD, replace the HD seed with a new one
            if (spk_man->IsHDEnabled()) {
                if (!spk_man->SetupGeneration(true)) {
                    return false;
                }
            }
        }
        Lock();

        // Need to completely rewrite the wallet file; if we don't, bdb might keep
        // bits of the unencrypted private key in slack space in the database file.
        GetDatabase().Rewrite();

        // BDB seems to have a bad habit of writing old data into
        // slack space in .dat files; that is bad if the old data is
        // unencrypted private keys. So:
        GetDatabase().ReloadDbEnv();

    }
    NotifyStatusChanged(this);

    return true;
}